

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  ZSTD_format_e format;
  size_t sVar1;
  ulong uVar2;
  unsigned_long_long uVar3;
  void *dst_00;
  byte *src_00;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  size_t sStack_90;
  void *local_80;
  ulong local_58;
  blockProperties_t local_44;
  void *local_38;
  
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5c5f,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ddict->dictContent;
    dictSize = ddict->dictSize;
  }
  bVar6 = false;
  local_80 = dst;
  local_58 = dstCapacity;
  while( true ) {
    while( true ) {
      sVar4 = 0xffffffffffffffb8;
      sVar1 = ZSTD_startingInputLength(dctx->format);
      if (srcSize < sVar1) {
        if (srcSize == 0) {
          sVar4 = (long)local_80 - (long)dst;
        }
        return sVar4;
      }
      if ((*src & 0xfffffff0) != 0x184d2a50) break;
      if (srcSize < 8) {
        return 0xffffffffffffffb8;
      }
      if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
        return 0xfffffffffffffff2;
      }
      uVar2 = (ulong)*(uint *)((long)src + 4) + 8;
      bVar5 = srcSize < uVar2;
      srcSize = srcSize - uVar2;
      if (bVar5) {
        return 0xffffffffffffffb8;
      }
      src = (void *)((long)src + uVar2);
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar1 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
      if (0xffffffffffffff88 < sVar1) {
        return sVar1;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    ZSTD_checkContinuity(dctx,local_80);
    format = dctx->format;
    if (srcSize < (ulong)(format == ZSTD_f_zstd1) * 4 + 5) {
      return 0xffffffffffffffb8;
    }
    local_38 = dict;
    sVar1 = ZSTD_frameHeaderSize_internal(src,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format);
    sStack_90 = sVar1;
    if (0xffffffffffffff88 < sVar1) break;
    if (srcSize < sVar1 + 3) {
      return 0xffffffffffffffb8;
    }
    sStack_90 = ZSTD_decodeFrameHeader(dctx,src,sVar1);
    if (0xffffffffffffff88 < sStack_90) break;
    src = (void *)((long)src + sVar1);
    srcSize = srcSize - sVar1;
    dst_00 = local_80;
    do {
      sVar1 = ZSTD_getcBlockSize(src,srcSize,&local_44);
      sStack_90 = sVar1;
      if (0xffffffffffffff88 < sVar1) goto LAB_0014c8be;
      uVar2 = srcSize - 3;
      srcSize = uVar2 - sVar1;
      if (uVar2 < sVar1) {
        sStack_90 = 0xffffffffffffffb8;
        goto LAB_0014c8be;
      }
      src_00 = (byte *)((long)src + 3);
      if (local_44.blockType == bt_compressed) {
        sStack_90 = ZSTD_decompressBlock_internal
                              (dctx,dst_00,(long)local_80 + (local_58 - (long)dst_00),src_00,sVar1,1
                              );
        if (0xffffffffffffff88 < sStack_90) goto LAB_0014c8be;
      }
      else if (local_44.blockType == bt_rle) {
        sStack_90 = (size_t)local_44.origSize;
        if (dst_00 == (void *)0x0) {
joined_r0x0014c7cf:
          if (sStack_90 != 0) {
            sStack_90 = 0xffffffffffffffb6;
            goto LAB_0014c8be;
          }
          sStack_90 = 0;
        }
        else {
          if ((long)local_80 + (local_58 - (long)dst_00) < sStack_90) {
LAB_0014c8af:
            sStack_90 = 0xffffffffffffffba;
            goto LAB_0014c8be;
          }
          memset(dst_00,(uint)*src_00,sStack_90);
        }
      }
      else {
        if (local_44.blockType != bt_raw) {
          sStack_90 = 0xffffffffffffffec;
          goto LAB_0014c8be;
        }
        if (dst_00 == (void *)0x0) goto joined_r0x0014c7cf;
        if ((long)local_80 + (local_58 - (long)dst_00) < sVar1) goto LAB_0014c8af;
        memcpy(dst_00,src_00,sVar1);
      }
      if ((dctx->fParams).checksumFlag != 0) {
        ZSTD_XXH64_update(&dctx->xxhState,dst_00,sStack_90);
      }
      dst_00 = (void *)((long)dst_00 + sStack_90);
      src = src_00 + sVar1;
    } while (local_44.lastBlock == 0);
    uVar2 = (dctx->fParams).frameContentSize;
    sStack_90 = (long)dst_00 - (long)local_80;
    if ((uVar2 != 0xffffffffffffffff) && (sStack_90 != uVar2)) {
      return 0xffffffffffffffec;
    }
    if ((dctx->fParams).checksumFlag != 0) {
      if ((srcSize < 4) || (uVar3 = ZSTD_XXH64_digest(&dctx->xxhState), *src != (uint)uVar3)) {
        return 0xffffffffffffffea;
      }
      src = (void *)((long)src + 4);
      srcSize = srcSize - 4;
    }
    if (0xffffffffffffff88 < sStack_90) break;
    bVar6 = local_58 < sStack_90;
    local_58 = local_58 - sStack_90;
    if (bVar6) {
      __assert_fail("res <= dstCapacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5ca5,
                    "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                   );
    }
    local_80 = (void *)((long)local_80 + sStack_90);
    bVar6 = true;
    dict = local_38;
  }
LAB_0014c8be:
  sVar1 = 0xffffffffffffffb8;
  if (!bVar6) {
    sVar1 = sStack_90;
  }
  if ((int)sStack_90 == -10) {
    return sVar1;
  }
  return sStack_90;
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <=- dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize);
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "at least one frame successfully completed, but following "
                "bytes are garbage: it's more likely to be a srcSize error, "
                "specifying more bytes than compressed size of frame(s). This "
                "error message replaces ERROR(prefix_unknown), which would be "
                "confusing, as the first header is actually correct. Note that "
                "one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic "
                "bytes. But this is _much_ less likely than a srcSize field "
                "error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (BYTE*)dst - (BYTE*)dststart;
}